

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *pIVar1;
  ImGuiTabItem *pIVar2;
  ImGuiDockNode *pIVar3;
  ImGuiID IVar4;
  ImU32 tab_id;
  ImGuiWindow *docked_window;
  long lVar5;
  long lVar6;
  
  pIVar1 = GImGui->CurrentTabBar;
  if ((pIVar1 == (ImGuiTabBar *)0x0) || ((pIVar1->Flags & 0x100000) != 0)) {
    docked_window = (ImGuiWindow *)FindWindowByName(label);
    if ((docked_window != (ImGuiWindow *)0x0) &&
       (((docked_window->field_0x3e1 & 1) != 0 &&
        (pIVar3 = docked_window->DockNode, pIVar3 != (ImGuiDockNode *)0x0)))) {
      tab_id = TabBarCalcTabID(pIVar3->TabBar,label,docked_window);
      TabBarRemoveTab(pIVar3->TabBar,tab_id);
      docked_window->field_0x3e1 = docked_window->field_0x3e1 | 8;
    }
  }
  else {
    IVar4 = ImGuiWindow::GetID((ImGuiWindow *)GImGui->CurrentWindow,label,(char *)0x0);
    if ((IVar4 != 0) && (lVar5 = (long)(pIVar1->Tabs).Size, 0 < lVar5)) {
      pIVar2 = (pIVar1->Tabs).Data;
      lVar6 = 0;
      do {
        if (*(ImGuiID *)((long)&pIVar2->ID + lVar6) == IVar4) {
          (&pIVar2->WantClose)[lVar6] = true;
          return;
        }
        lVar6 = lVar6 + 0x30;
      } while (lVar5 * 0x30 != lVar6);
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label, NULL);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
    else if (ImGuiWindow* window = FindWindowByName(label))
    {
        if (window->DockIsActive)
            if (ImGuiDockNode* node = window->DockNode)
            {
                ImGuiID tab_id = TabBarCalcTabID(node->TabBar, label, window);
                TabBarRemoveTab(node->TabBar, tab_id);
                window->DockTabWantClose = true;
            }
    }
}